

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_add_hl_hl_half_carry_and_carry_Test::TestBody
          (CpuTest_add_hl_hl_half_carry_and_carry_Test *this)

{
  bool bVar1;
  pointer pIVar2;
  char *message;
  AssertHelper local_58;
  Message local_50 [3];
  int local_38;
  uint local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  Registers expected_regs;
  CpuTest_add_hl_hl_half_carry_and_carry_Test *this_local;
  
  (this->super_CpuTest).regs.f = 0x80;
  (this->super_CpuTest).regs.h = 0xff;
  (this->super_CpuTest).regs.l = 0xff;
  CpuTest::execute_instruction(&this->super_CpuTest,')');
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb0feff0000000000;
  CpuTest::verify_state_changes(&this->super_CpuTest,(Registers *)&gtest_ar.message_);
  pIVar2 = std::unique_ptr<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>::
           operator->(&(this->super_CpuTest).cpu);
  local_34 = (*pIVar2->_vptr_ICpu[1])();
  local_38 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_30,"cpu->get_cycles_executed()","2",&local_34,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x382,message);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_hl_half_carry_and_carry) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 0xFF;
    regs.l = 0xFF;
    execute_instruction(0x29);

    ICpu::Registers expected_regs{};
    expected_regs.h = 0xFF;
    expected_regs.l = 0xFE;
    expected_regs.f = ICpu::Z_FLAG | ICpu::H_FLAG | ICpu::C_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}